

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O0

void __thiscall
test_suite::detail::simple_runner::fail
          (simple_runner *this,char *expr,char *file,int line,char *param_4)

{
  reference pvVar1;
  __int_type _Var2;
  ostream *poVar3;
  char *pcVar4;
  __int_type id;
  char *param_4_local;
  int line_local;
  char *file_local;
  char *expr_local;
  simple_runner *this_local;
  
  std::__atomic_base<unsigned_long>::operator++
            (&(this->all_).failed.super___atomic_base<unsigned_long>);
  pvVar1 = std::
           vector<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
           ::back(&this->v_);
  std::__atomic_base<unsigned_long>::operator++(&(pvVar1->total).super___atomic_base<unsigned_long>)
  ;
  pvVar1 = std::
           vector<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
           ::back(&this->v_);
  std::__atomic_base<unsigned_long>::operator++
            (&(pvVar1->failed).super___atomic_base<unsigned_long>);
  _Var2 = std::__atomic_base<unsigned_long>::operator++
                    (&(this->all_).total.super___atomic_base<unsigned_long>);
  poVar3 = std::operator<<(this->log_,"#");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<(poVar3," ");
  pcVar4 = filename(this,file);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"(");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
  poVar3 = std::operator<<(poVar3,") failed: ");
  poVar3 = std::operator<<(poVar3,expr);
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

void
  fail(
      char const* expr,
      char const* file,
      int line,
      char const*) override
  {
    ++all_.failed;
    ++v_.back().total;
    ++v_.back().failed;
    auto const id = ++all_.total;
    log_ <<
         "#" << id <<
         " " << filename(file) <<
         "(" << line << ") "
                        "failed: " << expr << "\n";
  }